

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

EncodingType httplib::detail::encoding_type(Request *req,Response *res)

{
  bool bVar1;
  string sStack_38;
  
  Response::get_header_value_abi_cxx11_(&sStack_38,res,"Content-Type",0);
  bVar1 = can_compress_content_type(&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  if (bVar1) {
    Request::get_header_value_abi_cxx11_(&sStack_38,req,"Accept-Encoding",0);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return None;
}

Assistant:

inline EncodingType encoding_type(const Request &req, const Response &res) {
  auto ret =
      detail::can_compress_content_type(res.get_header_value("Content-Type"));
  if (!ret) { return EncodingType::None; }

  const auto &s = req.get_header_value("Accept-Encoding");
  (void)(s);

#ifdef CPPHTTPLIB_BROTLI_SUPPORT
  // TODO: 'Accept-Encoding' has br, not br;q=0
  ret = s.find("br") != std::string::npos;
  if (ret) { return EncodingType::Brotli; }
#endif

#ifdef CPPHTTPLIB_ZLIB_SUPPORT
  // TODO: 'Accept-Encoding' has gzip, not gzip;q=0
  ret = s.find("gzip") != std::string::npos;
  if (ret) { return EncodingType::Gzip; }
#endif

  return EncodingType::None;
}